

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

void __thiscall BackwardPass::CleanupBackwardPassInfoInFlowGraph(BackwardPass *this)

{
  BasicBlock *local_18;
  BasicBlock *block;
  BackwardPass *this_local;
  
  if ((this->func->m_fg->hasBackwardPassInfo & 1U) != 0) {
    for (local_18 = this->func->m_fg->blockList; local_18 != (BasicBlock *)0x0;
        local_18 = local_18->next) {
      if (((*(ushort *)&local_18->field_0x18 & 1) == 0) ||
         ((*(ushort *)&local_18->field_0x18 >> 1 & 1) != 0)) {
        local_18->upwardExposedUses = (BVSparse<Memory::JitArenaAllocator> *)0x0;
        local_18->upwardExposedFields = (BVSparse<Memory::JitArenaAllocator> *)0x0;
        local_18->typesNeedingKnownObjectLayout = (BVSparse<Memory::JitArenaAllocator> *)0x0;
        local_18->slotDeadStoreCandidates = (BVSparse<Memory::JitArenaAllocator> *)0x0;
        local_18->byteCodeUpwardExposedUsed = (BVSparse<Memory::JitArenaAllocator> *)0x0;
        local_18->liveFixedFields = (BVSparse<Memory::JitArenaAllocator> *)0x0;
        local_18->byteCodeRestoreSyms = (StackSym **)0x0;
        local_18->excludeByteCodeUpwardExposedTracking = (BVSparse<Memory::JitArenaAllocator> *)0x0;
        local_18->tempNumberTracker = (TempNumberTracker *)0x0;
        local_18->tempObjectTracker = (TempObjectTracker *)0x0;
        local_18->tempObjectVerifyTracker = (TempObjectVerifyTracker *)0x0;
        local_18->stackSymToFinalType =
             (HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator> *)0x0;
        local_18->stackSymToGuardedProperties =
             (HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator> *)0x0;
        local_18->stackSymToWriteGuardsMap =
             (HashTable<ObjWriteGuardBucket,_Memory::ArenaAllocator> *)0x0;
        local_18->cloneStrCandidates = (BVSparse<Memory::JitArenaAllocator> *)0x0;
        local_18->noImplicitCallUses = (BVSparse<Memory::JitArenaAllocator> *)0x0;
        local_18->noImplicitCallNoMissingValuesUses = (BVSparse<Memory::JitArenaAllocator> *)0x0;
        local_18->noImplicitCallNativeArrayUses = (BVSparse<Memory::JitArenaAllocator> *)0x0;
        local_18->noImplicitCallJsArrayHeadSegmentSymUses =
             (BVSparse<Memory::JitArenaAllocator> *)0x0;
        local_18->noImplicitCallArrayLengthSymUses = (BVSparse<Memory::JitArenaAllocator> *)0x0;
        local_18->couldRemoveNegZeroBailoutForDef = (BVSparse<Memory::JitArenaAllocator> *)0x0;
        if (local_18->loop != (Loop *)0x0) {
          *(ushort *)&local_18->loop->field_0x178 = *(ushort *)&local_18->loop->field_0x178 & 0xfffd
          ;
          *(ushort *)&local_18->loop->field_0x178 = *(ushort *)&local_18->loop->field_0x178 & 0xfffb
          ;
        }
      }
    }
  }
  return;
}

Assistant:

void
BackwardPass::CleanupBackwardPassInfoInFlowGraph()
{
    if (!this->func->m_fg->hasBackwardPassInfo)
    {
        // No information to clean up
        return;
    }

    // The backward pass temp arena has already been deleted, we can just reset the data

    FOREACH_BLOCK_IN_FUNC_DEAD_OR_ALIVE(block, this->func)
    {
        block->upwardExposedUses = nullptr;
        block->upwardExposedFields = nullptr;
        block->typesNeedingKnownObjectLayout = nullptr;
        block->slotDeadStoreCandidates = nullptr;
        block->byteCodeUpwardExposedUsed = nullptr;
        block->liveFixedFields = nullptr;
#if DBG
        block->byteCodeRestoreSyms = nullptr;
        block->excludeByteCodeUpwardExposedTracking = nullptr;
#endif
        block->tempNumberTracker = nullptr;
        block->tempObjectTracker = nullptr;
#if DBG
        block->tempObjectVerifyTracker = nullptr;
#endif
        block->stackSymToFinalType = nullptr;
        block->stackSymToGuardedProperties = nullptr;
        block->stackSymToWriteGuardsMap = nullptr;
        block->cloneStrCandidates = nullptr;
        block->noImplicitCallUses = nullptr;
        block->noImplicitCallNoMissingValuesUses = nullptr;
        block->noImplicitCallNativeArrayUses = nullptr;
        block->noImplicitCallJsArrayHeadSegmentSymUses = nullptr;
        block->noImplicitCallArrayLengthSymUses = nullptr;
        block->couldRemoveNegZeroBailoutForDef = nullptr;

        if (block->loop != nullptr)
        {
            block->loop->hasDeadStoreCollectionPass = false;
            block->loop->hasDeadStorePrepass = false;
        }
    }
    NEXT_BLOCK_IN_FUNC_DEAD_OR_ALIVE;
}